

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26552d::CpuIntegrationTest_nmi_Test::~CpuIntegrationTest_nmi_Test
          (CpuIntegrationTest_nmi_Test *this)

{
  CpuIntegrationTest_nmi_Test *this_local;
  
  ~CpuIntegrationTest_nmi_Test(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, nmi) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 00     LDX #$00
    // $0602    a0 00     LDY #$00
    // $0604    e8        INX
    // $0605    4c 04 06  JMP $0604
    // nmi:
    // $1000    c8        INY
    // $1001    40        RTI
    load_hex_dump(0x0600,
            {0xa2, 0x00, 0xa0, 0x00, 0xe8, 0x4c, 0x04, 0x06, 0x00, 0x00});
    load_hex_dump(0x1000, {0xc8, 0x40, 0x00, 0x00});

    set_reset_address(0x0600);
    set_break_address(0xDEAD);
    set_nmi_address(0x1000);

    expected.x = 0x05;
    expected.y = 0x00;
    expected.pc = 0x0604;

    cpu->reset();
    // Run the loop 5 times to increase x
    step_execution(2 + 2 + (2 + 3) * 5); // ldx + ldy + (inx + jmp) * 5
    EXPECT_EQ(expected, registers);

    // Before jmp is finised, trigger an nmi
    step_execution(2 + 3 - 1); // inx + jmp - 1
    cpu->set_nmi(true);

    // jmp should finish before jumping to nmi
    expected.x = 0x06;
    step_execution(1);
    EXPECT_EQ(expected, registers);

    // Run rti subroutine and jump back
    expected.y = 0x01;
    expected.pc = 0x0604;
    expected.p |= FLAG_5;
    step_execution(7 + 2 + 6); // nmi + iny + rti
    EXPECT_EQ(expected, registers);
}